

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-context.cpp
# Opt level: O2

int32_t __thiscall llama_context::output_reserve(llama_context *this,int32_t n_outputs)

{
  ggml_backend_buffer_ptr *this_00;
  uint uVar1;
  uint uVar2;
  llama_model *plVar3;
  pointer piVar4;
  uint32_t uVar5;
  size_t sVar6;
  ulong uVar7;
  long lVar8;
  ggml_backend_dev_t pgVar9;
  long lVar10;
  pointer __p;
  float *pfVar11;
  float *pfVar12;
  pointer piVar13;
  ulong uVar14;
  byte bVar15;
  ggml_backend_buffer *pgVar16;
  ulong uVar17;
  byte bVar18;
  bool bVar19;
  bool bVar20;
  undefined1 auVar21 [16];
  
  plVar3 = this->model;
  uVar14 = (ulong)(this->cparams).n_seq_max;
  if ((long)uVar14 < (long)n_outputs) {
    uVar14 = (long)n_outputs;
  }
  uVar1 = (this->cparams).n_batch;
  uVar5 = llama_vocab::n_tokens(&plVar3->vocab);
  bVar20 = (this->cparams).embeddings;
  bVar15 = (this->cparams).pooling_type == LLAMA_POOLING_TYPE_NONE & bVar20;
  bVar19 = this->model->arch == LLM_ARCH_T5;
  uVar2 = (plVar3->hparams).n_embd;
  bVar18 = bVar20 ^ 1;
  sVar6 = uVar5 * uVar14;
  if ((bVar18 & 1) == 0 && !bVar19) {
    sVar6 = 0;
  }
  this->logits_size = sVar6;
  sVar6 = uVar2 * uVar14;
  if (bVar15 == 0 && !bVar19) {
    sVar6 = 0;
  }
  this->embd_size = sVar6;
  if ((this->output_ids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->output_ids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::vector<int,_std::allocator<int>_>::resize(&this->output_ids,(ulong)uVar1);
  }
  this_00 = &this->buf_output;
  if ((this->buf_output)._M_t.
      super___uniq_ptr_impl<ggml_backend_buffer,_ggml_backend_buffer_deleter>._M_t.
      super__Tuple_impl<0UL,_ggml_backend_buffer_*,_ggml_backend_buffer_deleter>.
      super__Head_base<0UL,_ggml_backend_buffer_*,_false>._M_head_impl == (ggml_backend_buffer *)0x0
     ) {
    bVar20 = true;
    pgVar16 = (ggml_backend_buffer *)0x0;
    uVar7 = 0;
  }
  else {
    uVar7 = ggml_backend_buffer_get_size();
    pgVar16 = (this_00->_M_t).
              super___uniq_ptr_impl<ggml_backend_buffer,_ggml_backend_buffer_deleter>._M_t.
              super__Tuple_impl<0UL,_ggml_backend_buffer_*,_ggml_backend_buffer_deleter>.
              super__Head_base<0UL,_ggml_backend_buffer_*,_false>._M_head_impl;
    bVar20 = pgVar16 == (ggml_backend_buffer *)0x0;
  }
  uVar17 = (this->embd_size + this->logits_size) * 4;
  if ((bVar20) || (uVar7 < uVar17)) {
    if (!bVar20) {
      std::__uniq_ptr_impl<ggml_backend_buffer,_ggml_backend_buffer_deleter>::reset
                ((__uniq_ptr_impl<ggml_backend_buffer,_ggml_backend_buffer_deleter> *)this_00,
                 (pointer)0x0);
      this->logits = (float *)0x0;
      this->embd = (float *)0x0;
    }
    lVar8 = ggml_backend_cpu_buffer_type();
    pgVar9 = llama_model::dev_output(this->model);
    if (pgVar9 == (ggml_backend_dev_t)0x0) {
      lVar10 = 0;
    }
    else {
      lVar10 = ggml_backend_dev_host_buffer_type(pgVar9);
    }
    if (lVar10 != 0) {
      lVar8 = lVar10;
    }
    __p = (pointer)ggml_backend_buft_alloc_buffer(lVar8,uVar17);
    std::__uniq_ptr_impl<ggml_backend_buffer,_ggml_backend_buffer_deleter>::reset
              ((__uniq_ptr_impl<ggml_backend_buffer,_ggml_backend_buffer_deleter> *)this_00,__p);
    pgVar16 = (this_00->_M_t).
              super___uniq_ptr_impl<ggml_backend_buffer,_ggml_backend_buffer_deleter>._M_t.
              super__Tuple_impl<0UL,_ggml_backend_buffer_*,_ggml_backend_buffer_deleter>.
              super__Head_base<0UL,_ggml_backend_buffer_*,_false>._M_head_impl;
    if (pgVar16 == (ggml_backend_buffer *)0x0) {
      auVar21._8_4_ = (int)(uVar17 >> 0x20);
      auVar21._0_8_ = uVar17;
      auVar21._12_4_ = 0x45300000;
      llama_log_internal(GGML_LOG_LEVEL_ERROR,
                         "%s: failed to allocate output buffer of size %.2f MiB\n",
                         ((auVar21._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)uVar17) - 4503599627370496.0)) *
                         9.5367431640625e-07,"output_reserve");
      uVar14 = 0;
      goto LAB_001d1d88;
    }
  }
  pfVar11 = (float *)ggml_backend_buffer_get_base(pgVar16);
  pfVar12 = (float *)0x0;
  if ((bVar18 & 1) != 0 || bVar19) {
    pfVar12 = pfVar11;
  }
  this->logits = pfVar12;
  piVar13 = (this->output_ids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar12 = pfVar11 + this->logits_size;
  if (bVar15 == 0 && !bVar19) {
    pfVar12 = (float *)0x0;
  }
  this->embd = pfVar12;
  piVar4 = (this->output_ids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (; piVar13 != piVar4; piVar13 = piVar13 + 1) {
    *piVar13 = -1;
  }
  ggml_backend_buffer_clear
            ((this->buf_output)._M_t.
             super___uniq_ptr_impl<ggml_backend_buffer,_ggml_backend_buffer_deleter>._M_t.
             super__Tuple_impl<0UL,_ggml_backend_buffer_*,_ggml_backend_buffer_deleter>.
             super__Head_base<0UL,_ggml_backend_buffer_*,_false>._M_head_impl,0);
  this->n_outputs = 0;
  this->n_outputs_max = (int32_t)uVar14;
LAB_001d1d88:
  return (int32_t)uVar14;
}

Assistant:

int32_t llama_context::output_reserve(int32_t n_outputs) {
    const auto & hparams = model.hparams;
    const auto & vocab   = model.vocab;

    const int64_t n_outputs_max = std::max<int64_t>(n_outputs, n_seq_max());

    const auto n_batch = cparams.n_batch;
    const auto n_vocab = vocab.n_tokens();
    const auto n_embd  = hparams.n_embd;

    // TODO: use a per-batch flag for logits presence instead
    bool has_logits = !cparams.embeddings;
    bool has_embd   =  cparams.embeddings && (cparams.pooling_type == LLAMA_POOLING_TYPE_NONE);

    // TODO: hacky enc-dec support
    if (model.arch == LLM_ARCH_T5) {
        has_logits = true;
        has_embd   = true;
    }

    logits_size = has_logits ? n_vocab*n_outputs_max : 0;
    embd_size   = has_embd   ?  n_embd*n_outputs_max : 0;

    if (output_ids.empty()) {
        // init, never resized afterwards
        output_ids.resize(n_batch);
    }

    const size_t prev_size = buf_output ? ggml_backend_buffer_get_size(buf_output.get()) : 0;
    const size_t new_size  = (logits_size + embd_size) * sizeof(float);

    // alloc only when more than the current capacity is required
    // TODO: also consider shrinking the buffer
    if (!buf_output || prev_size < new_size) {
        if (buf_output) {
#ifndef NDEBUG
            // This doesn't happen often, but may be annoying in some cases (like the HellaSwag benchmark)
            LLAMA_LOG_INFO("%s: reallocating output buffer from size %.02f MiB to %.02f MiB\n", __func__, prev_size / 1024.0 / 1024.0, new_size / 1024.0 / 1024.0);
#endif
            buf_output = nullptr;
            logits = nullptr;
            embd = nullptr;
        }

        auto * buft = ggml_backend_cpu_buffer_type();
        // try to use the host buffer of the device where the output tensor is allocated for faster transfer to system memory
        auto * output_dev = model.dev_output();
        auto * output_dev_host_buft = output_dev ? ggml_backend_dev_host_buffer_type(output_dev) : nullptr;
        if (output_dev_host_buft) {
            buft = output_dev_host_buft;
        }
        buf_output.reset(ggml_backend_buft_alloc_buffer(buft, new_size));
        if (buf_output == nullptr) {
            LLAMA_LOG_ERROR("%s: failed to allocate output buffer of size %.2f MiB\n", __func__, new_size / (1024.0 * 1024.0));
            return 0;
        }
    }

    float * output_base = (float *) ggml_backend_buffer_get_base(buf_output.get());

    logits = has_logits ? output_base               : nullptr;
    embd   = has_embd   ? output_base + logits_size : nullptr;

    // set all ids as invalid (negative)
    std::fill(output_ids.begin(), output_ids.end(), -1);

    ggml_backend_buffer_clear(buf_output.get(), 0);

    this->n_outputs     = 0;
    this->n_outputs_max = n_outputs_max;

    return n_outputs_max;
}